

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_graphics_pipeline
          (Impl *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar2;
  SubpassMeta meta;
  Value value;
  Value serialized_graphics_pipelines;
  Document doc;
  SubpassMeta local_14a;
  Data local_148;
  Data local_138;
  StringRefType local_128;
  StringRefType local_118;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_108;
  Data local_c8 [6];
  Stack<rapidjson::CrtAllocator> local_68;
  
  bVar2 = false;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_c8[0].s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_c8[0].n = (Number)0x0;
  local_c8[0].s.str = (Ch *)0x3000000000000;
  alloc = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)&local_c8[0].s);
  local_148.n = (Number)0x0;
  local_148.s.str = (Ch *)0x0;
  local_14a.uses_color = false;
  local_14a.uses_depth_stencil = false;
  bVar1 = get_subpass_meta_for_pipeline(this,create_info,(Hash)create_info->renderPass,&local_14a);
  if (bVar1) {
    bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (create_info,&local_14a,alloc,(Value *)&local_148.s);
    if (bVar1) {
      local_138.n.i64 = (Number)0x0;
      local_138.s.str = (Ch *)0x3000000000000;
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)&local_108,hash,alloc);
      allocator = alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_138.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_108,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_148.s,alloc);
      local_118.s = "version";
      local_118.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      AddMember<Fossilize::__2>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_c8[0].s,&local_118,(anon_enum_32)alloc,allocator);
      local_128.s = "graphicsPipelines";
      local_128.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8[0].s,&local_128,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_138.s,alloc);
      local_68.stack_ = (char *)0x0;
      local_68.stackTop_ = (char *)0x0;
      local_68.stackEnd_ = (char *)0x0;
      local_68.allocator_ = (CrtAllocator *)0x0;
      local_68.ownAllocator_ = (CrtAllocator *)0x0;
      local_68.initialCapacity_ = 0x100;
      local_108.level_stack_.allocator_ = (CrtAllocator *)0x0;
      local_108.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
      local_108.level_stack_.stackEnd_ = (char *)0x0;
      local_108.level_stack_.stack_ = (char *)0x0;
      local_108.level_stack_.stackTop_ = (char *)0x0;
      local_108.level_stack_.initialCapacity_ = 0x200;
      local_108.maxDecimalPlaces_ = 0x144;
      local_108.hasRoot_ = false;
      local_108.os_ =
           (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_68;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_c8[0].s,&local_108);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (blob,(long)local_68.stackTop_ - (long)local_68.stack_);
      __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        &local_68);
      memcpy(__dest,__src,(long)local_68.stackTop_ - (long)local_68.stack_);
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_108.level_stack_);
      rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_68);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_c8[0].s);
  return bVar2;
}

Assistant:

bool StateRecorder::Impl::serialize_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo &create_info, vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value value;

	StateRecorder::SubpassMeta meta = {};
	if (!get_subpass_meta_for_pipeline(create_info, api_object_cast<Hash>(create_info.renderPass), &meta))
		return false;

	if (!json_value(create_info, meta, alloc, &value))
		return false;

	Value serialized_graphics_pipelines(kObjectType);
	serialized_graphics_pipelines.AddMember(uint64_string(hash, alloc), value, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("graphicsPipelines", serialized_graphics_pipelines, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}